

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O1

string * __thiscall
duckdb::DialectCandidates::Print_abi_cxx11_(string *__return_storage_ptr__,DialectCandidates *this)

{
  vector<char,_true> *this_00;
  reference pvVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  reference pvVar4;
  ulong __n;
  pointer __n_00;
  pointer pcVar5;
  mapped_type quote_candidate;
  mapped_type escape_candidate;
  ostringstream search_space;
  byte local_1fa;
  value_type local_1f9;
  DialectCandidates *local_1f8;
  vector<char,_std::allocator<char>_> local_1f0;
  string *local_1d8;
  vector<char,_std::allocator<char>_> local_1d0;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1b8;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = this;
  local_1d8 = __return_storage_ptr__;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Delimiter Candidates: ",0x16);
  if ((local_1f8->delim_candidates).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_1f8->delim_candidates).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_1f8->delim_candidates,__n);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pvVar1->_M_dataplus)._M_p,pvVar1->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      if (__n < ((long)(local_1f8->delim_candidates).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_1f8->delim_candidates).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_1f8->delim_candidates).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_1f8->delim_candidates).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,anon_var_dwarf_6435278 + 8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Quote/Escape Candidates: ",0x19);
  local_1fa = 0;
  if (*(char *)&(local_1f8->quote_rule_candidates).
                super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                super__Vector_impl_data._M_finish !=
      *(char *)&(local_1f8->quote_rule_candidates).
                super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                super__Vector_impl_data._M_start) {
    local_1b0 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&local_1f8->quote_candidates_map;
    local_1b8 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&local_1f8->escape_candidates_map;
    do {
      pvVar3 = &::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_1b0,&local_1fa)->super_vector<char,_std::allocator<char>_>;
      ::std::vector<char,_std::allocator<char>_>::vector(&local_1f0,pvVar3);
      pvVar3 = &::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_1b8,&local_1fa)->super_vector<char,_std::allocator<char>_>;
      ::std::vector<char,_std::allocator<char>_>::vector(&local_1d0,pvVar3);
      if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          (pointer)CONCAT71(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            (value_type)
                            local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start)) {
        pcVar5 = (pointer)0x0;
        do {
          if (local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            __n_00 = (pointer)0x0;
            do {
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[\'",2);
              pvVar4 = vector<char,_true>::operator[]
                                 ((vector<char,_true> *)&local_1f0,(size_type)pcVar5);
              if (*pvVar4 == '\0') {
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"(no quote)",10);
              }
              else {
                pvVar4 = vector<char,_true>::operator[]
                                   ((vector<char,_true> *)&local_1f0,(size_type)pcVar5);
                local_1f9 = *pvVar4;
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,&local_1f9,1);
              }
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\',\'",3);
              pvVar4 = vector<char,_true>::operator[]
                                 ((vector<char,_true> *)&local_1d0,(size_type)__n_00);
              if (*pvVar4 == '\0') {
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"(no escape)",0xb);
              }
              else {
                pvVar4 = vector<char,_true>::operator[]
                                   ((vector<char,_true> *)&local_1d0,(size_type)__n_00);
                local_1f9 = *pvVar4;
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,&local_1f9,1);
              }
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\']",2);
              if (__n_00 < local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           ~(ulong)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start) {
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
              }
              __n_00 = __n_00 + 1;
            } while (__n_00 < local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish +
                              -(long)local_1d0.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
          }
          if (pcVar5 < local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       ~CONCAT71(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 (value_type)
                                 local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start)) {
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
          }
          pcVar5 = pcVar5 + 1;
        } while (pcVar5 < local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                          -CONCAT71(local_1f0.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    (value_type)
                                    local_1f0.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start));
      }
      if ((pointer)(ulong)local_1fa <
          (local_1f8->quote_rule_candidates).
          super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
          super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
          super__Vector_impl_data._M_finish +
          ~(ulong)(local_1f8->quote_rule_candidates).
                  super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                  super__Vector_impl_data._M_start) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      if (local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT71(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (value_type)
                           local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_1f0.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         (value_type)
                                         local_1f0.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start));
      }
      local_1fa = local_1fa + 1;
    } while ((uint)local_1fa <
             (*(int *)&(local_1f8->quote_rule_candidates).
                       super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                       super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(local_1f8->quote_rule_candidates).
                       super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                       super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0xffU));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,anon_var_dwarf_6435278 + 8,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Comment Candidates: ",0x14);
  if ((local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish !=
      (local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &local_1f8->comment_candidates;
    pcVar5 = (pointer)0x0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
      pvVar4 = vector<char,_true>::operator[](this_00,(size_type)pcVar5);
      local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = *pvVar4;
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1f0,1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      if (pcVar5 < (local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish +
                   ~(ulong)(local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>
                           .super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < (local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                      -(long)(local_1f8->comment_candidates).
                             super_vector<char,_std::allocator<char>_>.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,anon_var_dwarf_6435278 + 8,1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return local_1d8;
}

Assistant:

string DialectCandidates::Print() {
	std::ostringstream search_space;

	search_space << "Delimiter Candidates: ";
	for (idx_t i = 0; i < delim_candidates.size(); i++) {
		search_space << "\'" << delim_candidates[i] << "\'";
		if (i < delim_candidates.size() - 1) {
			search_space << ", ";
		}
	}
	search_space << "\n";
	search_space << "Quote/Escape Candidates: ";
	for (uint8_t i = 0; i < static_cast<uint8_t>(quote_rule_candidates.size()); i++) {
		auto quote_candidate = quote_candidates_map[i];
		auto escape_candidate = escape_candidates_map[i];
		for (idx_t j = 0; j < quote_candidate.size(); j++) {
			for (idx_t k = 0; k < escape_candidate.size(); k++) {
				search_space << "[\'";
				if (quote_candidate[j] == '\0') {
					search_space << "(no quote)";
				} else {
					search_space << quote_candidate[j];
				}
				search_space << "\',\'";
				if (escape_candidate[k] == '\0') {
					search_space << "(no escape)";
				} else {
					search_space << escape_candidate[k];
				}
				search_space << "\']";
				if (k < escape_candidate.size() - 1) {
					search_space << ",";
				}
			}
			if (j < quote_candidate.size() - 1) {
				search_space << ",";
			}
		}
		if (i < quote_rule_candidates.size() - 1) {
			search_space << ",";
		}
	}
	search_space << "\n";

	search_space << "Comment Candidates: ";
	for (idx_t i = 0; i < comment_candidates.size(); i++) {
		search_space << "\'" << comment_candidates[i] << "\'";
		if (i < comment_candidates.size() - 1) {
			search_space << ", ";
		}
	}
	search_space << "\n";

	return search_space.str();
}